

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

Field __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSubField
          (HeapTypeGeneratorImpl *this,Field super)

{
  ulong uVar1;
  Type type;
  ulong uVar2;
  Field FVar3;
  
  uVar2 = super._8_8_;
  type = super.type.id;
  uVar1 = uVar2 >> 0x20;
  if (uVar1 != 1) {
    if (type.id != 2 && super.packedType != not_packed) {
      __assert_fail("type == Type::i32 && \"unexpected type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x28a,"bool wasm::Field::isPacked() const");
    }
    if (super.packedType == not_packed) {
      type = generateSubtype(this,type);
      uVar2 = 0;
      uVar1 = 0;
    }
  }
  FVar3._8_8_ = uVar2 & 0xffffffff | uVar1 << 0x20;
  FVar3.type.id = type.id;
  return FVar3;
}

Assistant:

Field generateSubField(Field super) {
    if (super.mutable_ == Mutable) {
      // Only immutable fields support subtyping.
      return super;
    }
    if (super.isPacked()) {
      // No other subtypes of i8 or i16.
      return super;
    }
    return {generateSubtype(super.type), Immutable};
  }